

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractbutton.cpp
# Opt level: O0

void __thiscall QAbstractButton::keyPressEvent(QAbstractButton *this,QKeyEvent *e)

{
  bool bVar1;
  int iVar2;
  LayoutDirection LVar3;
  QAbstractButtonPrivate *pQVar4;
  QPlatformTheme *pQVar5;
  QWidget *pQVar6;
  QAbstractItemView *pQVar7;
  ulong uVar8;
  QKeyEvent *in_RSI;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  int in_stack_00000024;
  QAbstractButtonPrivate *in_stack_00000028;
  bool reverse;
  QWidget *w;
  QWidget *pw;
  bool next;
  QAbstractButtonPrivate *d;
  QList<Qt::Key> buttonPressKeys;
  int key;
  QWidget *in_stack_ffffffffffffff58;
  QListSpecialMethodsBase<Qt::Key> *in_stack_ffffffffffffff60;
  QAbstractButtonPrivate *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  undefined1 local_61;
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = d_func((QAbstractButton *)0x500b75);
  local_61 = 1;
  iVar2 = QKeyEvent::key(in_RSI);
  pQVar5 = QGuiApplicationPrivate::platformTheme();
  (**(code **)(*(long *)pQVar5 + 0x60))(&local_28,pQVar5,0x28);
  ::QVariant::value<QList<Qt::Key>>((QVariant *)in_stack_ffffffffffffff58);
  ::QVariant::~QVariant(&local_28);
  bVar1 = QListSpecialMethodsBase<Qt::Key>::contains<int>
                    (in_stack_ffffffffffffff60,(int *)in_stack_ffffffffffffff58);
  if ((bVar1) && (bVar1 = QKeyEvent::isAutoRepeat(in_RSI), !bVar1)) {
    setDown((QAbstractButton *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
            SUB81((ulong)in_stack_ffffffffffffff68 >> 0x38,0));
    QWidget::repaint(in_stack_ffffffffffffff58);
    QAbstractButtonPrivate::emitPressed(in_stack_ffffffffffffff68);
    goto LAB_00500e01;
  }
  if (iVar2 != 0x1000012) {
    if (iVar2 == 0x1000013) {
      local_61 = 0;
    }
    else if (1 < iVar2 + 0xfeffffecU) {
      uVar8 = QKeyEvent::matches((StandardKey)in_RSI);
      if (((uVar8 & 1) == 0) || (((byte)pQVar4->field_0x28c >> 4 & 1) == 0)) {
        QEvent::ignore((QEvent *)in_RSI);
      }
      else {
        setDown((QAbstractButton *)CONCAT44(iVar2,in_stack_ffffffffffffff70),
                SUB81((ulong)in_stack_ffffffffffffff68 >> 0x38,0));
        QWidget::repaint(in_stack_ffffffffffffff58);
        QAbstractButtonPrivate::emitReleased(in_stack_ffffffffffffff68);
      }
      goto LAB_00500e01;
    }
  }
  pQVar6 = QWidget::parentWidget((QWidget *)0x500c7e);
  if ((((byte)pQVar4->field_0x28c >> 3 & 1) == 0) && (pQVar4->group == (QButtonGroup *)0x0)) {
    if (pQVar6 != (QWidget *)0x0) {
      QWidget::parentWidget((QWidget *)0x500cbc);
      pQVar7 = qobject_cast<QAbstractItemView*>((QObject *)0x500cc4);
      if (pQVar7 != (QAbstractItemView *)0x0) goto LAB_00500cca;
    }
    LVar3 = QWidget::layoutDirection((QWidget *)0x500d3d);
    iVar2 = QKeyEvent::key(in_RSI);
    if (((iVar2 == 0x1000012) && (LVar3 != RightToLeft)) ||
       ((iVar2 = QKeyEvent::key(in_RSI), iVar2 == 0x1000014 && (LVar3 == RightToLeft)))) {
      local_61 = 0;
    }
    (**(code **)(*(long *)in_RDI + 0x198))(in_RDI,local_61);
  }
  else {
LAB_00500cca:
    QKeyEvent::key(in_RSI);
    QAbstractButtonPrivate::moveFocus(in_stack_00000028,in_stack_00000024);
    bVar1 = QWidget::hasFocus(in_RDI);
    if (bVar1) {
      QEvent::ignore((QEvent *)in_RSI);
    }
  }
LAB_00500e01:
  QList<Qt::Key>::~QList((QList<Qt::Key> *)0x500e0b);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractButton::keyPressEvent(QKeyEvent *e)
{
    Q_D(QAbstractButton);
    bool next = true;

    const auto key = e->key();
    const auto buttonPressKeys = QGuiApplicationPrivate::platformTheme()
                                         ->themeHint(QPlatformTheme::ButtonPressKeys)
                                         .value<QList<Qt::Key>>();
    if (buttonPressKeys.contains(key) && !e->isAutoRepeat()) {
        setDown(true);
        repaint();
        d->emitPressed();
        return;
    }

    switch (key) {
    case Qt::Key_Up:
        next = false;
        Q_FALLTHROUGH();
    case Qt::Key_Left:
    case Qt::Key_Right:
    case Qt::Key_Down: {
#ifdef QT_KEYPAD_NAVIGATION
        if ((QApplicationPrivate::keypadNavigationEnabled()
                && (e->key() == Qt::Key_Left || e->key() == Qt::Key_Right))
                || (!QApplication::navigationMode() == Qt::NavigationModeKeypadDirectional
                || (e->key() == Qt::Key_Up || e->key() == Qt::Key_Down))) {
            e->ignore();
            return;
        }
#endif
        QWidget *pw = parentWidget();
        if (d->autoExclusive
#if QT_CONFIG(buttongroup)
        || d->group
#endif
#if QT_CONFIG(itemviews)
        || (pw && qobject_cast<QAbstractItemView *>(pw->parentWidget()))
#endif
        ) {
            // ### Using qobject_cast to check if the parent is a viewport of
            // QAbstractItemView is a crude hack, and should be revisited and
            // cleaned up when fixing task 194373. It's here to ensure that we
            // keep compatibility outside QAbstractItemView.
            d->moveFocus(e->key());
            if (hasFocus()) // nothing happened, propagate
                e->ignore();
        } else {
            // Prefer parent widget, use this if parent is absent
            QWidget *w = pw ? pw : this;
            bool reverse = (w->layoutDirection() == Qt::RightToLeft);
            if ((e->key() == Qt::Key_Left && !reverse)
                || (e->key() == Qt::Key_Right && reverse)) {
                next = false;
            }
            focusNextPrevChild(next);
        }
        break;
    }
    default:
#ifndef QT_NO_SHORTCUT
        if (e->matches(QKeySequence::Cancel) && d->down) {
            setDown(false);
            repaint();
            d->emitReleased();
            return;
        }
#endif
        e->ignore();
    }